

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

zip_t * zip_stream_openwitherror(char *stream,size_t size,int level,char mode,int *errnum)

{
  mz_bool mVar1;
  zip_t *pZip;
  zip_t *zip;
  int *errnum_local;
  char mode_local;
  int level_local;
  size_t size_local;
  char *stream_local;
  
  pZip = (zip_t *)calloc(1,0x4e078);
  if (pZip == (zip_t *)0x0) {
    *errnum = -0x15;
    return (zip_t *)0x0;
  }
  errnum_local._4_4_ = level;
  if (level < 0) {
    errnum_local._4_4_ = 6;
  }
  if ((errnum_local._4_4_ & 0xf) < 0xb) {
    pZip->level = errnum_local._4_4_;
    if (((stream == (char *)0x0) || (size == 0)) || (mode != 'r')) {
      if (((stream == (char *)0x0) && (size == 0)) && (mode == 'w')) {
        mVar1 = mz_zip_writer_init_heap((mz_zip_archive *)pZip,0,0x400);
        if (mVar1 != 0) goto LAB_00120ec5;
        *errnum = -0x1f;
      }
      else {
        *errnum = -4;
      }
    }
    else {
      mVar1 = mz_zip_reader_init_mem((mz_zip_archive *)pZip,stream,size,0);
      if (mVar1 != 0) {
LAB_00120ec5:
        *errnum = 0;
        return pZip;
      }
      *errnum = -0x1e;
    }
  }
  else {
    *errnum = -5;
  }
  if (pZip != (zip_t *)0x0) {
    free(pZip);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_stream_openwitherror(const char *stream, size_t size,
                                       int level, char mode, int *errnum) {
  struct zip_t *zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip) {
    // out of memory
    *errnum = ZIP_EOOMEM;
    return NULL;
  }

  if (level < 0) {
    level = MZ_DEFAULT_LEVEL;
  }
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    *errnum = ZIP_EINVLVL;
    goto cleanup;
  }
  zip->level = (mz_uint)level;

  if ((stream != NULL) && (size > 0) && (mode == 'r')) {
    if (!mz_zip_reader_init_mem(&(zip->archive), stream, size, 0)) {
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
  } else if ((stream == NULL) && (size == 0) && (mode == 'w')) {
    // Create a new archive.
    if (!mz_zip_writer_init_heap(&(zip->archive), 0, 1024)) {
      // Cannot initialize zip_archive writer
      *errnum = ZIP_EWINIT;
      goto cleanup;
    }
  } else {
    *errnum = ZIP_EINVMODE;
    goto cleanup;
  }

  *errnum = 0;
  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}